

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O2

void ggml_backend_sched_set_tensor_backend
               (ggml_backend_sched_t sched,ggml_tensor *node,ggml_backend_t backend)

{
  int *piVar1;
  int iVar2;
  size_t sVar3;
  
  iVar2 = ggml_backend_sched_backend_id(sched,backend);
  if ((-1 < iVar2) && (iVar2 < sched->n_backends)) {
    piVar1 = sched->hv_tensor_backend_ids;
    sVar3 = ggml_hash_find_or_insert(&sched->hash_set,node);
    piVar1[sVar3] = iVar2;
    sched->is_reset = false;
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
             ,0x65e,"GGML_ASSERT(%s) failed",
             "backend_index >= 0 && backend_index < sched->n_backends");
}

Assistant:

void ggml_backend_sched_set_tensor_backend(ggml_backend_sched_t sched, struct ggml_tensor * node, ggml_backend_t backend) {
    int backend_index = ggml_backend_sched_backend_id(sched, backend);
    GGML_ASSERT(backend_index >= 0 && backend_index < sched->n_backends);
    tensor_backend_id(node) = backend_index;
    SET_CAUSE(node, "usr");
    sched->is_reset = false;
}